

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.cpp
# Opt level: O2

void __thiscall
cppcms::widgets::select_multiple::render_input(select_multiple *this,form_context *context)

{
  ostream *poVar1;
  ostream *poVar2;
  pointer peVar3;
  uint uVar4;
  ulong uVar5;
  char *pcVar6;
  escape local_78;
  streamable local_50;
  
  base_widget::auto_generate(&this->super_base_widget,context);
  poVar1 = form_context::out(context);
  if (context->widget_part_type_ == 0) {
    pcVar6 = "<select multiple ";
    if (context->html_type_ == 1) {
      pcVar6 = "<select multiple=\"multiple\" ";
    }
    std::operator<<(poVar1,pcVar6);
    if (this->rows_ != 0) {
      poVar1 = std::operator<<(poVar1," size=\"");
      local_78.obj_.ptr_._0_4_ = this->rows_;
      impl::details::write_int_to_stream<unsigned_int>::operator()
                ((write_int_to_stream<unsigned_int> *)&local_78,poVar1);
      std::operator<<(poVar1,"\" ");
    }
    (*(this->super_base_widget).super_base_form._vptr_base_form[9])(this,context);
  }
  else {
    std::operator<<(poVar1," >\n");
    uVar4 = 0;
    while( true ) {
      uVar5 = (ulong)uVar4;
      peVar3 = (this->elements_).
               super__Vector_base<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(((long)(this->elements_).
                         super__Vector_base<cppcms::widgets::select_multiple::element,_std::allocator<cppcms::widgets::select_multiple::element>_>
                         ._M_impl.super__Vector_impl_data._M_finish - (long)peVar3) / 200) <= uVar5)
      break;
      poVar2 = std::operator<<(poVar1,"<option value=\"");
      util::escape((string *)&local_78,&peVar3[uVar5].id);
      poVar2 = std::operator<<(poVar2,(string *)&local_78);
      std::operator<<(poVar2,"\" ");
      peVar3 = peVar3 + uVar5;
      std::__cxx11::string::~string((string *)&local_78);
      if ((undefined1  [200])((undefined1  [200])*peVar3 & (undefined1  [200])0x1) !=
          (undefined1  [200])0x0) {
        pcVar6 = "selected ";
        if (context->html_type_ == 1) {
          pcVar6 = "selected=\"selected\" ";
        }
        std::operator<<(poVar1,pcVar6);
      }
      std::operator<<(poVar1,">");
      if ((undefined1  [200])((undefined1  [200])*peVar3 & (undefined1  [200])0x2) ==
          (undefined1  [200])0x0) {
        util::escape((string *)&local_78,&peVar3->str_option);
        std::operator<<(poVar1,(string *)&local_78);
        std::__cxx11::string::~string((string *)&local_78);
      }
      else {
        filters::streamable::streamable<booster::locale::basic_message<char>>
                  (&local_50,&peVar3->tr_option);
        filters::escape::escape(&local_78,&local_50);
        filters::escape::operator()(&local_78,poVar1);
        filters::escape::~escape(&local_78);
        filters::streamable::~streamable(&local_50);
      }
      std::operator<<(poVar1,"</option>\n");
      uVar4 = uVar4 + 1;
    }
    std::operator<<(poVar1,"</select>");
  }
  return;
}

Assistant:

void select_multiple::render_input(form_context &context)
{
	auto_generate(&context);
	std::ostream &out=context.out();
	if(context.widget_part() == first_part) {
		if(context.html() == as_xhtml)
			out<<"<select multiple=\"multiple\" ";
		else
			out<<"<select multiple ";
		if(rows_ > 0)
			out << " size=\"" << cint(rows_) << "\" ";
		render_attributes(context);
	}
	else {
		out<<" >\n";
		for(unsigned i=0;i<elements_.size();i++) {
			element &el=elements_[i];
			out << "<option value=\"" << util::escape(el.id) <<"\" ";
			if(el.selected) {
				if(context.html() == as_xhtml)
					out << "selected=\"selected\" ";
				else
					out << "selected ";
			}
			out << ">";
			if(el.need_translation)
				out << filters::escape(el.tr_option);
			else
				out << util::escape(el.str_option);
			out << "</option>\n";
		}
		out << "</select>";
	}
}